

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

spv_operand_pattern_t *
spvAlternatePatternFollowingImmediate
          (spv_operand_pattern_t *__return_storage_ptr__,spv_operand_pattern_t *pattern)

{
  initializer_list<spv_operand_type_t> __l;
  bool bVar1;
  difference_type dVar2;
  reference pvVar3;
  allocator<spv_operand_type_t> local_6d;
  spv_operand_type_t local_6c;
  iterator local_68;
  size_type local_60;
  allocator<spv_operand_type_t> local_55;
  value_type local_54;
  undefined1 local_50 [28];
  undefined4 local_34;
  undefined1 local_30 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
  local_20;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
  it;
  spv_operand_pattern_t *pattern_local;
  spv_operand_pattern_t *alternatePattern;
  
  it.current._M_current =
       (__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>
        )(__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>
          )pattern;
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::crbegin
            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)(local_30 + 8));
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::crend
            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)local_30);
  local_34 = 3;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<spv_operand_type_t_const*,std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>>>,spv_operand_type_t>
            (&local_20,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
              *)(local_30 + 8),(spv_operand_type_t *)local_30);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::crend
            ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)(local_50 + 0x10));
  bVar1 = std::operator!=(&local_20,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
                           *)(local_50 + 0x10));
  if (bVar1) {
    local_50[0xf] = 0;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::crbegin
              ((vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> *)local_50);
    dVar2 = std::operator-(&local_20,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_spv_operand_type_t_*,_std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>_>_>
                            *)local_50);
    local_54 = SPV_OPERAND_TYPE_OPTIONAL_CIV;
    std::allocator<spv_operand_type_t>::allocator(&local_55);
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
              (__return_storage_ptr__,dVar2 + 2,&local_54,&local_55);
    std::allocator<spv_operand_type_t>::~allocator(&local_55);
    pvVar3 = std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::operator[]
                       (__return_storage_ptr__,1);
    *pvVar3 = SPV_OPERAND_TYPE_RESULT_ID;
  }
  else {
    local_6c = SPV_OPERAND_TYPE_OPTIONAL_CIV;
    local_68 = &local_6c;
    local_60 = 1;
    std::allocator<spv_operand_type_t>::allocator(&local_6d);
    __l._M_len = local_60;
    __l._M_array = local_68;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
              (__return_storage_ptr__,__l,&local_6d);
    std::allocator<spv_operand_type_t>::~allocator(&local_6d);
  }
  return __return_storage_ptr__;
}

Assistant:

spv_operand_pattern_t spvAlternatePatternFollowingImmediate(
    const spv_operand_pattern_t& pattern) {
  auto it =
      std::find(pattern.crbegin(), pattern.crend(), SPV_OPERAND_TYPE_RESULT_ID);
  if (it != pattern.crend()) {
    spv_operand_pattern_t alternatePattern(it - pattern.crbegin() + 2,
                                           SPV_OPERAND_TYPE_OPTIONAL_CIV);
    alternatePattern[1] = SPV_OPERAND_TYPE_RESULT_ID;
    return alternatePattern;
  }

  // No result-id found, so just expect CIVs.
  return {SPV_OPERAND_TYPE_OPTIONAL_CIV};
}